

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall
ncnn::NetPrivate::do_forward_layer
          (NetPrivate *this,Layer *layer,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *blob_mats,
          Option *opt)

{
  undefined8 *puVar1;
  pointer pMVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  pointer piVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  int iVar13;
  int *piVar14;
  ulong uVar15;
  ulong uVar16;
  pointer pMVar17;
  NetPrivate *this_00;
  NetPrivate *pNVar18;
  NetPrivate *pNVar19;
  void *in_R8;
  size_t i;
  long lVar20;
  pointer pMVar21;
  size_t i_2;
  bool bVar22;
  allocator_type local_c9;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> top_blobs;
  int local_b0;
  NetPrivate *local_a8;
  int iStack_a0;
  int iStack_9c;
  int iStack_98;
  int iStack_94;
  int local_90;
  pointer local_88;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> bottom_blobs;
  int local_60;
  Allocator *local_58;
  int iStack_50;
  int iStack_4c;
  int iStack_48;
  int iStack_44;
  int local_40;
  pointer local_38;
  
  if (layer->one_blob_only != true) {
    this_00 = (NetPrivate *)&bottom_blobs;
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
              ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)this_00,
               (long)(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2,(allocator_type *)&top_blobs);
    lVar20 = 0;
    uVar16 = 0;
    do {
      pMVar21 = bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar6 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar15 = (long)(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)piVar6 >> 2;
      if (uVar15 <= uVar16) {
        if ((opt->lightmode == true) && (layer->support_inplace == true)) {
          iVar13 = (*layer->_vptr_Layer[8])(layer,&bottom_blobs,opt);
          if (iVar13 != 0) goto LAB_00135e0b;
          lVar20 = 0;
          for (uVar16 = 0;
              pMVar21 = bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_start,
              piVar6 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
              uVar16 < (ulong)((long)(layer->tops).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >> 2);
              uVar16 = uVar16 + 1) {
            pMVar17 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start + piVar6[uVar16];
            if ((pointer)((long)&(bottom_blobs.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                  super__Vector_impl_data._M_start)->data + lVar20) != pMVar17) {
              piVar14 = *(int **)((long)&(bottom_blobs.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_start)->refcount +
                                 lVar20);
              if (piVar14 != (int *)0x0) {
                LOCK();
                *piVar14 = *piVar14 + 1;
                UNLOCK();
              }
              piVar14 = pMVar17->refcount;
              if (piVar14 != (int *)0x0) {
                LOCK();
                *piVar14 = *piVar14 + -1;
                UNLOCK();
                if (*piVar14 == 0) {
                  if (pMVar17->allocator == (Allocator *)0x0) {
                    free(pMVar17->data);
                  }
                  else {
                    (*pMVar17->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              pMVar17->cstep = 0;
              pMVar17->data = (void *)0x0;
              pMVar17->refcount = (int *)0x0;
              *(undefined8 *)((long)&pMVar17->refcount + 4) = 0;
              *(undefined8 *)((long)&pMVar17->elemsize + 4) = 0;
              pMVar17->c = 0;
              pMVar17->dims = 0;
              pMVar17->w = 0;
              pMVar17->h = 0;
              pMVar17->d = 0;
              puVar1 = (undefined8 *)((long)&pMVar21->data + lVar20);
              piVar14 = (int *)puVar1[1];
              pMVar17->data = (void *)*puVar1;
              pMVar17->refcount = piVar14;
              pMVar17->elemsize = *(size_t *)((long)&pMVar21->elemsize + lVar20);
              pMVar17->elempack = *(int *)((long)&pMVar21->elempack + lVar20);
              pMVar17->allocator = *(Allocator **)((long)&pMVar21->allocator + lVar20);
              piVar14 = (int *)((long)&pMVar21->dims + lVar20);
              iVar13 = piVar14[1];
              iVar4 = piVar14[2];
              iVar5 = piVar14[3];
              pMVar17->dims = *piVar14;
              pMVar17->w = iVar13;
              pMVar17->h = iVar4;
              pMVar17->d = iVar5;
              pMVar17->c = *(int *)((long)&pMVar21->c + lVar20);
              pMVar17->cstep = *(size_t *)((long)&pMVar21->cstep + lVar20);
            }
            lVar20 = lVar20 + 0x48;
          }
LAB_00135f2d:
          bVar22 = true;
          if (opt->lightmode == true) {
            iVar13 = 0;
            for (uVar16 = 0;
                piVar6 = (layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                uVar16 < (ulong)((long)(layer->bottoms).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish - (long)piVar6 >> 2);
                uVar16 = uVar16 + 1) {
              iVar4 = piVar6[uVar16];
              pMVar17 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              pMVar21 = pMVar17 + iVar4;
              piVar14 = pMVar17[iVar4].refcount;
              if (piVar14 != (int *)0x0) {
                LOCK();
                *piVar14 = *piVar14 + -1;
                UNLOCK();
                if (*piVar14 == 0) {
                  if (pMVar21->allocator == (Allocator *)0x0) {
                    free(pMVar21->data);
                  }
                  else {
                    (*pMVar21->allocator->_vptr_Allocator[3])();
                  }
                }
              }
              pMVar21->cstep = 0;
              pMVar21->data = (void *)0x0;
              pMVar21->refcount = (int *)0x0;
              *(undefined8 *)((long)&pMVar21->refcount + 4) = 0;
              *(undefined8 *)((long)&pMVar21->elemsize + 4) = 0;
              pMVar21->dims = 0;
              pMVar21->w = 0;
              pMVar21->h = 0;
              pMVar21->d = 0;
              pMVar21->c = 0;
            }
          }
          else {
            iVar13 = 0;
          }
        }
        else {
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                    (&top_blobs,
                     (long)(layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2,&local_c9);
          iVar13 = (*layer->_vptr_Layer[6])(layer,&bottom_blobs,&top_blobs,opt);
          if (iVar13 == 0) {
            lVar20 = 0;
            for (uVar16 = 0;
                pMVar21 = top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                piVar6 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                uVar16 < (ulong)((long)(layer->tops).super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >> 2
                                ); uVar16 = uVar16 + 1) {
              pMVar17 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start + piVar6[uVar16];
              if ((pointer)((long)&(top_blobs.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->data + lVar20) !=
                  pMVar17) {
                piVar14 = *(int **)((long)&(top_blobs.
                                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->refcount +
                                   lVar20);
                if (piVar14 != (int *)0x0) {
                  LOCK();
                  *piVar14 = *piVar14 + 1;
                  UNLOCK();
                }
                piVar14 = pMVar17->refcount;
                if (piVar14 != (int *)0x0) {
                  LOCK();
                  *piVar14 = *piVar14 + -1;
                  UNLOCK();
                  if (*piVar14 == 0) {
                    if (pMVar17->allocator == (Allocator *)0x0) {
                      free(pMVar17->data);
                    }
                    else {
                      (*pMVar17->allocator->_vptr_Allocator[3])();
                    }
                  }
                }
                pMVar17->cstep = 0;
                pMVar17->data = (void *)0x0;
                pMVar17->refcount = (int *)0x0;
                *(undefined8 *)((long)&pMVar17->refcount + 4) = 0;
                *(undefined8 *)((long)&pMVar17->elemsize + 4) = 0;
                pMVar17->c = 0;
                pMVar17->dims = 0;
                pMVar17->w = 0;
                pMVar17->h = 0;
                pMVar17->d = 0;
                puVar1 = (undefined8 *)((long)&pMVar21->data + lVar20);
                piVar14 = (int *)puVar1[1];
                pMVar17->data = (void *)*puVar1;
                pMVar17->refcount = piVar14;
                pMVar17->elemsize = *(size_t *)((long)&pMVar21->elemsize + lVar20);
                pMVar17->elempack = *(int *)((long)&pMVar21->elempack + lVar20);
                pMVar17->allocator = *(Allocator **)((long)&pMVar21->allocator + lVar20);
                puVar1 = (undefined8 *)((long)&pMVar21->dims + lVar20);
                uVar7 = *puVar1;
                uVar8 = puVar1[1];
                pMVar17->dims = (int)uVar7;
                pMVar17->w = (int)((ulong)uVar7 >> 0x20);
                pMVar17->h = (int)uVar8;
                pMVar17->d = (int)((ulong)uVar8 >> 0x20);
                pMVar17->c = *(int *)((long)&pMVar21->c + lVar20);
                pMVar17->cstep = *(size_t *)((long)&pMVar21->cstep + lVar20);
              }
              lVar20 = lVar20 + 0x48;
            }
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&top_blobs);
            goto LAB_00135f2d;
          }
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&top_blobs);
LAB_00135e0b:
          bVar22 = false;
        }
        goto LAB_00135e0d;
      }
      pMVar17 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start + piVar6[uVar16];
      piVar14 = *(int **)((long)&(bottom_blobs.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                  super__Vector_impl_data._M_start)->refcount + lVar20);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          this_00 = *(NetPrivate **)
                     ((long)&(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                              ._M_impl.super__Vector_impl_data._M_start)->data + lVar20);
          pNVar18 = *(NetPrivate **)
                     ((long)&(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                              ._M_impl.super__Vector_impl_data._M_start)->allocator + lVar20);
          if (pNVar18 == (NetPrivate *)0x0) {
            free(this_00);
          }
          else {
            (**(code **)&((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pNVar18->opt)->
                          _M_impl).super__Vector_impl_data._M_start)->elempack)();
            this_00 = pNVar18;
          }
        }
      }
      puVar1 = (undefined8 *)((long)&pMVar21->data + lVar20);
      *(undefined8 *)((long)&pMVar21->cstep + lVar20) = 0;
      *(undefined8 *)((long)puVar1 + 0xc) = 0;
      *(undefined8 *)((long)puVar1 + 0x14) = 0;
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined4 *)((long)&pMVar21->c + lVar20) = 0;
      puVar1 = (undefined8 *)((long)&pMVar21->dims + lVar20);
      *puVar1 = 0;
      puVar1[1] = 0;
      if (((opt->lightmode == true) && (layer->support_inplace == true)) &&
         (*pMVar17->refcount != 1)) {
        this_00 = (NetPrivate *)&top_blobs;
        Mat::clone((Mat *)&top_blobs,(__fn *)pMVar17,opt->blob_allocator,(int)uVar15,opt);
        pMVar21 = bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pNVar18 = (NetPrivate *)
                  ((long)&(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_start)->data + lVar20);
        piVar14 = (int *)CONCAT44(top_blobs.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                  super__Vector_impl_data._M_finish._4_4_,
                                  top_blobs.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                  super__Vector_impl_data._M_finish._0_4_);
        if (pNVar18 != (NetPrivate *)&top_blobs) {
          if (piVar14 != (int *)0x0) {
            LOCK();
            *piVar14 = *piVar14 + 1;
            UNLOCK();
          }
          piVar14 = *(int **)((long)&(bottom_blobs.
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->refcount + lVar20);
          if (piVar14 != (int *)0x0) {
            LOCK();
            *piVar14 = *piVar14 + -1;
            UNLOCK();
            if (*piVar14 == 0) {
              this_00 = *(NetPrivate **)
                         ((long)&(bottom_blobs.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                  super__Vector_impl_data._M_start)->data + lVar20);
              pNVar19 = *(NetPrivate **)
                         ((long)&(bottom_blobs.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                  super__Vector_impl_data._M_start)->allocator + lVar20);
              if (pNVar19 == (NetPrivate *)0x0) {
                free(this_00);
              }
              else {
                (**(code **)&((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pNVar19->opt
                               )->_M_impl).super__Vector_impl_data._M_start)->elempack)();
                this_00 = pNVar19;
              }
            }
          }
          *(undefined8 *)((long)&pMVar21->cstep + lVar20) = 0;
          *(undefined8 *)
           ((long)&(pNVar18->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                   _M_impl.super__Vector_impl_data._M_start + 4) = 0;
          *(undefined8 *)
           ((long)&(pNVar18->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
          pNVar18->opt = (Option *)0x0;
          (pNVar18->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          puVar1 = (undefined8 *)((long)&pMVar21->dims + lVar20);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined4 *)((long)&pMVar21->c + lVar20) = 0;
          *(pointer *)((long)&pMVar21->data + lVar20) =
               top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start;
          piVar14 = (int *)CONCAT44(top_blobs.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                    top_blobs.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._0_4_);
          *(int **)((long)&pMVar21->refcount + lVar20) = piVar14;
          *(ulong *)((long)&pMVar21->elemsize + lVar20) =
               CONCAT44(top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_,
                        top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._0_4_);
          *(int *)((long)&pMVar21->elempack + lVar20) = local_b0;
          *(NetPrivate **)((long)&pMVar21->allocator + lVar20) = local_a8;
          piVar3 = (int *)((long)&pMVar21->dims + lVar20);
          *piVar3 = iStack_a0;
          piVar3[1] = iStack_9c;
          piVar3[2] = iStack_98;
          piVar3[3] = iStack_94;
          *(int *)((long)&pMVar21->c + lVar20) = local_90;
          *(pointer *)((long)&pMVar21->cstep + lVar20) = local_88;
        }
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + -1;
          UNLOCK();
          if (*piVar14 == 0) {
            if (local_a8 == (NetPrivate *)0x0) {
              this_00 = (NetPrivate *)
                        top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                        super__Vector_impl_data._M_start;
              free(top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start);
            }
            else {
              this_00 = local_a8;
              (**(code **)&((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_a8->opt)
                            ->_M_impl).super__Vector_impl_data._M_start)->elempack)();
            }
          }
        }
        iVar13 = -100;
        if ((*(long *)((long)&(bottom_blobs.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data._M_start)->data + lVar20) == 0) ||
           ((long)*(int *)((long)&(bottom_blobs.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                                   .super__Vector_impl_data._M_start)->c + lVar20) *
            *(long *)((long)&(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                              ._M_impl.super__Vector_impl_data._M_start)->cstep + lVar20) == 0))
        goto LAB_00135e0b;
      }
      pMVar21 = bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((*(int *)((long)&(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_start)->dims + lVar20) == 0) &&
         (pMVar2 = (pointer)((long)&(bottom_blobs.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->data + lVar20),
         pMVar2 != pMVar17)) {
        piVar14 = pMVar17->refcount;
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + 1;
          UNLOCK();
        }
        piVar14 = *(int **)((long)&(bottom_blobs.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_start)->refcount + lVar20);
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + -1;
          UNLOCK();
          if (*piVar14 == 0) {
            this_00 = *(NetPrivate **)
                       ((long)&(bottom_blobs.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_start)->data + lVar20);
            pNVar18 = *(NetPrivate **)
                       ((long)&(bottom_blobs.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_start)->allocator + lVar20);
            if (pNVar18 == (NetPrivate *)0x0) {
              free(this_00);
            }
            else {
              (**(code **)&((((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pNVar18->opt)
                            ->_M_impl).super__Vector_impl_data._M_start)->elempack)();
              this_00 = pNVar18;
            }
          }
        }
        puVar1 = (undefined8 *)((long)&pMVar21->data + lVar20);
        puVar1[8] = 0;
        *(undefined8 *)((long)&pMVar2->refcount + 4) = 0;
        *(undefined8 *)((long)&pMVar2->elemsize + 4) = 0;
        pMVar2->data = (void *)0x0;
        pMVar2->refcount = (int *)0x0;
        *(undefined4 *)(puVar1 + 7) = 0;
        puVar1[5] = 0;
        puVar1[6] = 0;
        piVar14 = pMVar17->refcount;
        *puVar1 = pMVar17->data;
        puVar1[1] = piVar14;
        puVar1[2] = pMVar17->elemsize;
        *(int *)(puVar1 + 3) = pMVar17->elempack;
        puVar1[4] = pMVar17->allocator;
        uVar7 = *(undefined8 *)&pMVar17->h;
        puVar1[5] = *(undefined8 *)&pMVar17->dims;
        puVar1[6] = uVar7;
        *(int *)(puVar1 + 7) = pMVar17->c;
        puVar1[8] = pMVar17->cstep;
      }
      iVar13 = convert_layout(this_00,(Mat *)((long)&(bottom_blobs.
                                                                                                            
                                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->data +
                                             lVar20),layer,opt);
      uVar16 = uVar16 + 1;
      lVar20 = lVar20 + 0x48;
    } while (iVar13 == 0);
    bVar22 = false;
LAB_00135e0d:
    std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&bottom_blobs);
    goto joined_r0x00135e1e;
  }
  piVar14 = (layer->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar4 = *(layer->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5 = *piVar14;
  local_88 = (pointer)0x0;
  pMVar21 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start + iVar4;
  top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0;
  top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = 0;
  top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_b0 = 0;
  local_a8 = (NetPrivate *)0x0;
  iStack_a0 = 0;
  iStack_9c = 0;
  iStack_98 = 0;
  iStack_94 = 0;
  local_90 = 0;
  if (((opt->lightmode == true) && (layer->support_inplace == true)) && (*pMVar21->refcount != 1)) {
    Mat::clone((Mat *)&bottom_blobs,(__fn *)pMVar21,opt->blob_allocator,(int)piVar14,in_R8);
    piVar14 = (int *)CONCAT44(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                              ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                              bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                              ._M_impl.super__Vector_impl_data._M_finish._0_4_);
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + 1;
      UNLOCK();
    }
    piVar14 = (int *)CONCAT44(top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_finish._4_4_,
                              top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                              _M_impl.super__Vector_impl_data._M_finish._0_4_);
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        free(top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start);
      }
    }
    piVar14 = (int *)CONCAT44(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                              ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                              bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                              ._M_impl.super__Vector_impl_data._M_finish._0_4_);
    top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_start =
         bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
         super__Vector_impl_data._M_start;
    top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ =
         bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
         super__Vector_impl_data._M_finish._0_4_;
    top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ =
         bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
         super__Vector_impl_data._M_finish._4_4_;
    top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ =
         bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._0_4_;
    top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._4_4_;
    local_b0 = local_60;
    local_a8 = (NetPrivate *)local_58;
    iStack_a0 = iStack_50;
    iStack_9c = iStack_4c;
    iStack_98 = iStack_48;
    iStack_94 = iStack_44;
    local_90 = local_40;
    local_88 = local_38;
    if (piVar14 != (int *)0x0) {
      LOCK();
      *piVar14 = *piVar14 + -1;
      UNLOCK();
      if (*piVar14 == 0) {
        if (local_58 == (Allocator *)0x0) {
          free(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
        else {
          (*local_58->_vptr_Allocator[3])();
        }
      }
    }
    iVar13 = -100;
    if ((top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
         super__Vector_impl_data._M_start != (pointer)0x0) && ((long)local_40 * (long)local_38 != 0)
       ) {
      bVar22 = iStack_50 != 0;
      goto LAB_001359f0;
    }
LAB_001360be:
    bVar22 = false;
  }
  else {
    bVar22 = false;
LAB_001359f0:
    if ((!bVar22) && ((pointer)&top_blobs != pMVar21)) {
      piVar14 = pMVar21->refcount;
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + 1;
        UNLOCK();
      }
      piVar14 = (int *)CONCAT44(top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                _M_impl.super__Vector_impl_data._M_finish._0_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (local_a8 == (NetPrivate *)0x0) {
            free(top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start);
          }
          else {
            (**(_func_int **)((long)local_a8->opt + 0x18))();
          }
        }
      }
      top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pMVar21->data;
      top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = SUB84(pMVar21->refcount,0);
      top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)pMVar21->refcount >> 0x20);
      top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = (undefined4)pMVar21->elemsize;
      top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)(pMVar21->elemsize >> 0x20);
      local_b0 = pMVar21->elempack;
      local_a8 = (NetPrivate *)pMVar21->allocator;
      uVar9 = pMVar21->dims;
      uVar10 = pMVar21->w;
      uVar11 = pMVar21->h;
      uVar12 = pMVar21->d;
      local_90 = pMVar21->c;
      local_88 = (pointer)pMVar21->cstep;
      iStack_a0 = uVar9;
      iStack_9c = uVar10;
      iStack_98 = uVar11;
      iStack_94 = uVar12;
    }
    iVar13 = convert_layout((NetPrivate *)opt,(Mat *)&top_blobs,layer,opt);
    if (iVar13 != 0) goto LAB_001360be;
    if ((opt->lightmode != true) || (layer->support_inplace != true)) {
      bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0;
      bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0;
      bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      iVar13 = (*layer->_vptr_Layer[7])(layer,&top_blobs,(pointer)&bottom_blobs);
      if (iVar13 == 0) {
        pMVar21 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start + iVar5;
        piVar14 = (int *)CONCAT44(bottom_blobs.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                  super__Vector_impl_data._M_finish._4_4_,
                                  bottom_blobs.
                                  super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                  super__Vector_impl_data._M_finish._0_4_);
        if (pMVar21 != (pointer)&bottom_blobs) {
          if (piVar14 != (int *)0x0) {
            LOCK();
            *piVar14 = *piVar14 + 1;
            UNLOCK();
          }
          piVar14 = pMVar21->refcount;
          if (piVar14 != (int *)0x0) {
            LOCK();
            *piVar14 = *piVar14 + -1;
            UNLOCK();
            if (*piVar14 == 0) {
              if (pMVar21->allocator == (Allocator *)0x0) {
                free(pMVar21->data);
              }
              else {
                (*pMVar21->allocator->_vptr_Allocator[3])();
              }
            }
          }
          pMVar21->cstep = 0;
          pMVar21->data = (void *)0x0;
          pMVar21->refcount = (int *)0x0;
          *(undefined8 *)((long)&pMVar21->refcount + 4) = 0;
          *(undefined8 *)((long)&pMVar21->elemsize + 4) = 0;
          pMVar21->dims = 0;
          pMVar21->w = 0;
          pMVar21->h = 0;
          pMVar21->d = 0;
          pMVar21->c = 0;
          pMVar21->data =
               bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start;
          piVar14 = (int *)CONCAT44(bottom_blobs.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                    bottom_blobs.
                                    super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                    _M_impl.super__Vector_impl_data._M_finish._0_4_);
          pMVar21->refcount = piVar14;
          pMVar21->elemsize =
               CONCAT44(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                        bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
          pMVar21->elempack = 0;
          pMVar21->allocator = (Allocator *)0x0;
          pMVar21->dims = 0;
          pMVar21->w = 0;
          pMVar21->h = 0;
          pMVar21->d = 0;
          pMVar21->c = 0;
          pMVar21->cstep = 0;
        }
        if (piVar14 != (int *)0x0) {
          LOCK();
          *piVar14 = *piVar14 + -1;
          UNLOCK();
          if (*piVar14 == 0) {
            free(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                 super__Vector_impl_data._M_start);
          }
        }
        goto LAB_0013655b;
      }
      piVar14 = (int *)CONCAT44(bottom_blobs.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                bottom_blobs.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          free(bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      goto LAB_001360be;
    }
    iVar13 = (*layer->_vptr_Layer[9])(layer,(pointer)&top_blobs,opt);
    if (iVar13 != 0) goto LAB_001360be;
    pMVar21 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start + iVar5;
    if (pMVar21 != (pointer)&top_blobs) {
      piVar14 = (int *)CONCAT44(top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                _M_impl.super__Vector_impl_data._M_finish._0_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + 1;
        UNLOCK();
      }
      piVar14 = pMVar21->refcount;
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (pMVar21->allocator == (Allocator *)0x0) {
            free(pMVar21->data);
          }
          else {
            (*pMVar21->allocator->_vptr_Allocator[3])();
          }
        }
      }
      pMVar21->cstep = 0;
      pMVar21->data = (void *)0x0;
      pMVar21->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar21->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar21->elemsize + 4) = 0;
      pMVar21->c = 0;
      pMVar21->dims = 0;
      pMVar21->w = 0;
      pMVar21->h = 0;
      pMVar21->d = 0;
      pMVar21->data =
           top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
           super__Vector_impl_data._M_start;
      pMVar21->refcount =
           (int *)CONCAT44(top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_finish._4_4_,
                           top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                           _M_impl.super__Vector_impl_data._M_finish._0_4_);
      pMVar21->elemsize =
           CONCAT44(top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_,
                    top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._0_4_);
      pMVar21->elempack = local_b0;
      pMVar21->allocator = (Allocator *)local_a8;
      pMVar21->dims = iStack_a0;
      pMVar21->w = iStack_9c;
      pMVar21->h = iStack_98;
      pMVar21->d = iStack_94;
      pMVar21->c = local_90;
      pMVar21->cstep = (size_t)local_88;
    }
LAB_0013655b:
    bVar22 = true;
    if (opt->lightmode == true) {
      pMVar17 = (blob_mats->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      pMVar21 = pMVar17 + iVar4;
      piVar14 = pMVar17[iVar4].refcount;
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if (pMVar21->allocator == (Allocator *)0x0) {
            free(pMVar21->data);
          }
          else {
            (*pMVar21->allocator->_vptr_Allocator[3])();
          }
        }
      }
      iVar13 = 0;
      pMVar21->cstep = 0;
      pMVar21->data = (void *)0x0;
      pMVar21->refcount = (int *)0x0;
      *(undefined8 *)((long)&pMVar21->refcount + 4) = 0;
      *(undefined8 *)((long)&pMVar21->elemsize + 4) = 0;
      pMVar21->dims = 0;
      pMVar21->w = 0;
      pMVar21->h = 0;
      pMVar21->d = 0;
      pMVar21->c = 0;
    }
    else {
      iVar13 = 0;
    }
  }
  piVar14 = (int *)CONCAT44(top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_finish._4_4_,
                            top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                            _M_impl.super__Vector_impl_data._M_finish._0_4_);
  if (piVar14 != (int *)0x0) {
    LOCK();
    *piVar14 = *piVar14 + -1;
    UNLOCK();
    if (*piVar14 == 0) {
      if (local_a8 == (NetPrivate *)0x0) {
        free(top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
             super__Vector_impl_data._M_start);
      }
      else {
        (**(_func_int **)((long)local_a8->opt + 0x18))();
      }
    }
  }
joined_r0x00135e1e:
  if (bVar22) {
    iVar13 = 0;
  }
  return iVar13;
}

Assistant:

int NetPrivate::do_forward_layer(const Layer* layer, std::vector<Mat>& blob_mats, const Option& opt) const
{
    if (layer->one_blob_only)
    {
        int bottom_blob_index = layer->bottoms[0];
        int top_blob_index = layer->tops[0];

        Mat& bottom_blob_ref = blob_mats[bottom_blob_index];
        Mat bottom_blob;

        if (opt.lightmode)
        {
            // deep copy for inplace forward if data is shared
            if (layer->support_inplace && *bottom_blob_ref.refcount != 1)
            {
                bottom_blob = bottom_blob_ref.clone(opt.blob_allocator);
                if (bottom_blob.empty())
                    return -100;
            }
        }
        if (bottom_blob.dims == 0)
        {
            bottom_blob = bottom_blob_ref;
        }

        int ret = convert_layout(bottom_blob, layer, opt);
        if (ret != 0)
            return ret;

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            Mat& bottom_top_blob = bottom_blob;
            int ret = layer->forward_inplace(bottom_top_blob, opt);
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = bottom_top_blob;
        }
        else
        {
            Mat top_blob;
            int ret = layer->forward(bottom_blob, top_blob, opt);
            if (ret != 0)
                return ret;

            // store top blob
            blob_mats[top_blob_index] = top_blob;
        }

        if (opt.lightmode)
        {
            // delete after taken in light mode
            blob_mats[bottom_blob_index].release();
        }
    }
    else
    {
        std::vector<Mat> bottom_blobs(layer->bottoms.size());
        for (size_t i = 0; i < layer->bottoms.size(); i++)
        {
            int bottom_blob_index = layer->bottoms[i];

            Mat& bottom_blob_ref = blob_mats[bottom_blob_index];
            bottom_blobs[i].release();

            if (opt.lightmode)
            {
                // deep copy for inplace forward if data is shared
                if (layer->support_inplace && *bottom_blob_ref.refcount != 1)
                {
                    bottom_blobs[i] = bottom_blob_ref.clone(opt.blob_allocator);
                    if (bottom_blobs[i].empty())
                        return -100;
                }
            }
            if (bottom_blobs[i].dims == 0)
            {
                bottom_blobs[i] = bottom_blob_ref;
            }

            int ret = convert_layout(bottom_blobs[i], layer, opt);
            if (ret != 0)
                return ret;
        }

        // forward
        if (opt.lightmode && layer->support_inplace)
        {
            std::vector<Mat>& bottom_top_blobs = bottom_blobs;
            int ret = layer->forward_inplace(bottom_top_blobs, opt);
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i = 0; i < layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = bottom_top_blobs[i];
            }
        }
        else
        {
            std::vector<Mat> top_blobs(layer->tops.size());
            int ret = layer->forward(bottom_blobs, top_blobs, opt);
            if (ret != 0)
                return ret;

            // store top blobs
            for (size_t i = 0; i < layer->tops.size(); i++)
            {
                int top_blob_index = layer->tops[i];

                blob_mats[top_blob_index] = top_blobs[i];
            }
        }

        if (opt.lightmode)
        {
            for (size_t i = 0; i < layer->bottoms.size(); i++)
            {
                int bottom_blob_index = layer->bottoms[i];

                // delete after taken in light mode
                blob_mats[bottom_blob_index].release();
            }
        }
    }

    return 0;
}